

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O2

HT_Timeline * ht_global_timeline_get(void)

{
  undefined8 *puVar1;
  long lVar2;
  HT_Timeline *pHVar3;
  
  lVar2 = __tls_get_addr(&PTR_0010efa8);
  pHVar3 = *(HT_Timeline **)(lVar2 + 8);
  if (pHVar3 == (HT_Timeline *)0x0) {
    puVar1 = (undefined8 *)(lVar2 + 8);
    pHVar3 = ht_timeline_create(global_timeline_buffer_size,0,1,"HT_GlobalTimeline",
                                (HT_ErrorCode *)0x0);
    ht_feature_callstack_enable(pHVar3);
    ht_feature_cached_string_enable(pHVar3,0);
    *puVar1 = pHVar3;
    pthread_once(&timeline_once_control,create_key);
    pthread_setspecific(timeline_key,(void *)*puVar1);
    pHVar3 = (HT_Timeline *)*puVar1;
  }
  return pHVar3;
}

Assistant:

HT_Timeline* ht_global_timeline_get(void)
{
    static HT_THREAD_LOCAL HT_Timeline* c_timeline = NULL;

    if (!c_timeline)
    {
        c_timeline = _ht_global_timeline_create();
        pthread_once(&timeline_once_control, create_key);
        pthread_setspecific(timeline_key, c_timeline);
    }

    return c_timeline;
}